

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

void mod2sparse_copyrows(mod2sparse *m,mod2sparse *r,int *rows)

{
  int iVar1;
  mod2entry *pmVar2;
  char *__ptr;
  long lVar3;
  size_t sStack_30;
  
  if (r->n_cols < m->n_cols) {
    __ptr = "mod2sparse_copyrows: Destination matrix has fewer columns than source\n";
    sStack_30 = 0x46;
  }
  else {
    mod2sparse_clear(r);
    lVar3 = 0;
    while( true ) {
      if (r->n_rows <= lVar3) {
        return;
      }
      iVar1 = rows[lVar3];
      if (((long)iVar1 < 0) || (m->n_rows <= iVar1)) break;
      pmVar2 = m->rows + iVar1;
      while (pmVar2 = pmVar2->right, -1 < pmVar2->row) {
        mod2sparse_insert(r,(int)lVar3,pmVar2->col);
      }
      lVar3 = lVar3 + 1;
    }
    __ptr = "mod2sparse_copyrows: Row index out of range\n";
    sStack_30 = 0x2c;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  exit(1);
}

Assistant:

void mod2sparse_copyrows
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *rows		/* Indexes of rows to copy, from 0 */
)
{ 
  mod2entry *e;
  int i;

  if (mod2sparse_cols(m)>mod2sparse_cols(r))
  { fprintf(stderr,
     "mod2sparse_copyrows: Destination matrix has fewer columns than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { if (rows[i]<0 || rows[i]>=mod2sparse_rows(m))
    { fprintf(stderr,"mod2sparse_copyrows: Row index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_row(m,rows[i]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,i,e->col);
      e = mod2sparse_next_in_row(e);
    }
  }
}